

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O2

string * __thiscall
cmCTestGIT::FindGitDir_abi_cxx11_(string *__return_storage_ptr__,cmCTestGIT *this)

{
  bool bVar1;
  long lVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string git_dir_line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  git_rev_parse;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128;
  string git;
  OneLineParser rev_parse_out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  OutputLogger rev_parse_err;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::string
            ((string *)&git,(string *)&(this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool
            );
  std::__cxx11::string::string((string *)&rev_parse_out,(string *)&git);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rev_parse_out.super_LineParser.Line._M_string_length,"rev-parse",
             (allocator<char> *)&rev_parse_err);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rev_parse_out.Line1,"--git-dir",(allocator<char> *)&git_dir_line);
  __l._M_len = 3;
  __l._M_array = (iterator)&rev_parse_out;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&git_rev_parse,__l,(allocator_type *)&local_88);
  lVar2 = 0x40;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&rev_parse_out.super_LineParser.super_OutputParser._vptr_OutputParser + lVar2)
              );
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  git_dir_line._M_dataplus._M_p = (pointer)&git_dir_line.field_2;
  git_dir_line._M_string_length = 0;
  git_dir_line.field_2._M_local_buf[0] = '\0';
  OneLineParser::OneLineParser(&rev_parse_out,this,"rev-parse-out> ",&git_dir_line);
  cmProcessTools::OutputLogger::OutputLogger
            (&rev_parse_err,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"rev-parse-err> ");
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  local_128._M_string_length = 0;
  local_128.field_2._M_local_buf[0] = '\0';
  bVar1 = cmCTestVC::RunChild((cmCTestVC *)this,&git_rev_parse,(OutputParser *)&rev_parse_out,
                              (OutputParser *)&rev_parse_err,&local_128,UTF8);
  std::__cxx11::string::~string((string *)&local_128);
  if (bVar1) {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  if (__return_storage_ptr__->_M_string_length == 0) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  if (*(__return_storage_ptr__->_M_dataplus)._M_p == '.') {
    std::operator+(&local_148,&(this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory,"/");
    std::operator+(&local_88,&local_148,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_148);
  }
  cmProcessTools::LineParser::~LineParser(&rev_parse_err.super_LineParser);
  cmProcessTools::LineParser::~LineParser(&rev_parse_out.super_LineParser);
  std::__cxx11::string::~string((string *)&git_dir_line);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&git_rev_parse);
  std::__cxx11::string::~string((string *)&git);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestGIT::FindGitDir()
{
  std::string git_dir;

  // Run "git rev-parse --git-dir" to locate the real .git directory.
  std::string git = this->CommandLineTool;
  std::vector<std::string> git_rev_parse = { git, "rev-parse", "--git-dir" };
  std::string git_dir_line;
  OneLineParser rev_parse_out(this, "rev-parse-out> ", git_dir_line);
  OutputLogger rev_parse_err(this->Log, "rev-parse-err> ");
  if (this->RunChild(git_rev_parse, &rev_parse_out, &rev_parse_err,
                     std::string{}, cmProcessOutput::UTF8)) {
    git_dir = git_dir_line;
  }
  if (git_dir.empty()) {
    git_dir = ".git";
  }

  // Git reports a relative path only when the .git directory is in
  // the current directory.
  if (git_dir[0] == '.') {
    git_dir = this->SourceDirectory + "/" + git_dir;
  }
#if defined(_WIN32) && !defined(__CYGWIN__)
  else if (git_dir[0] == '/') {
    // Cygwin Git reports a full path that Cygwin understands, but we
    // are a Windows application.  Run "cygpath" to get Windows path.
    std::string cygpath_exe =
      cmStrCat(cmSystemTools::GetFilenamePath(git), "/cygpath.exe");
    if (cmSystemTools::FileExists(cygpath_exe)) {
      std::vector<std::string> cygpath = { cygpath_exe, "-w", git_dir };
      OneLineParser cygpath_out(this, "cygpath-out> ", git_dir_line);
      OutputLogger cygpath_err(this->Log, "cygpath-err> ");
      if (this->RunChild(cygpath, &cygpath_out, &cygpath_err, std::string{},
                         cmProcessOutput::UTF8)) {
        git_dir = git_dir_line;
      }
    }
  }
#endif
  return git_dir;
}